

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<Kernel::Literal*>::
sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
          (DArray<Kernel::Literal_*> *this,
          Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
          *comp)

{
  Literal *pLVar1;
  Literal *pLVar2;
  int iVar3;
  Comparison CVar4;
  size_t sVar5;
  Literal **ppLVar6;
  unsigned_long *puVar7;
  DArray<Kernel::Literal_*> *in_RDI;
  Literal *aux_1;
  Literal *aux;
  size_t r;
  size_t l;
  Literal *mid;
  size_t m;
  size_t p;
  size_t to;
  size_t from;
  unsigned_long in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  DArray<unsigned_long> *in_stack_ffffffffffffff20;
  Literal *in_stack_ffffffffffffff28;
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
  *in_stack_ffffffffffffff30;
  DArray<unsigned_long> *in_stack_ffffffffffffff38;
  Literal *pLVar8;
  size_t local_58;
  ulong local_50;
  ulong local_40;
  size_t local_38;
  ulong local_30;
  ulong local_28;
  
  if (1 < in_RDI->_size) {
    if ((sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
         ::ft == '\0') &&
       (iVar3 = __cxa_guard_acquire(&sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
                                     ::ft), iVar3 != 0)) {
      DArray<unsigned_long>::DArray(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __cxa_atexit(DArray<unsigned_long>::~DArray,
                   &DArray<Kernel::Literal_*>::
                    sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                    ::ft,&__dso_handle);
      __cxa_guard_release(&sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>(Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>)
                           ::ft);
    }
    local_28 = 0;
    sVar5 = DArray<Kernel::Literal_*>::size(in_RDI);
    local_30 = sVar5 - 1;
    DArray<unsigned_long>::ensure(in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
    local_38 = 0;
    while( true ) {
      do {
        iVar3 = Random::getInteger((int)(in_stack_ffffffffffffff10 >> 0x20));
        local_40 = local_28 + (long)iVar3;
        ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40);
        pLVar1 = *ppLVar6;
        local_50 = local_28;
        local_58 = local_30;
        while (local_50 < local_40) {
          DArray<Kernel::Literal_*>::operator[](in_RDI,local_50);
          CVar4 = Kernel::LiteralComparators::
                  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
                  ::compare(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                            (Literal *)in_stack_ffffffffffffff20);
          if ((uint)(1U - CVar4) < 2) {
            local_50 = local_50 + 1;
          }
          else if (CVar4 == LESS) {
            if (local_40 == local_58) {
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_50);
              pLVar8 = *ppLVar6;
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40);
              *ppLVar6 = pLVar8;
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40 - 1);
              pLVar8 = *ppLVar6;
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_50);
              *ppLVar6 = pLVar8;
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40 - 1);
              *ppLVar6 = pLVar1;
              local_40 = local_40 - 1;
            }
            else {
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_50);
              pLVar8 = *ppLVar6;
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_58);
              pLVar2 = *ppLVar6;
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_50);
              *ppLVar6 = pLVar2;
              ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_58);
              *ppLVar6 = pLVar8;
            }
            local_58 = local_58 - 1;
          }
        }
        while (local_40 < local_58) {
          DArray<Kernel::Literal_*>::operator[](in_RDI,local_40 + 1);
          CVar4 = Kernel::LiteralComparators::
                  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
                  ::compare(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                            (Literal *)in_stack_ffffffffffffff20);
          if (-CVar4 == 0xffffffff) {
            ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_58);
            pLVar8 = *ppLVar6;
            ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40 + 1);
            in_stack_ffffffffffffff30 =
                 (Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
                  *)*ppLVar6;
            ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_58);
            *ppLVar6 = (Literal *)in_stack_ffffffffffffff30;
            ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40 + 1);
            *ppLVar6 = pLVar8;
            local_58 = local_58 - 1;
          }
          else if ((uint)-CVar4 < 2) {
            ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40 + 1);
            in_stack_ffffffffffffff20 = (DArray<unsigned_long> *)*ppLVar6;
            ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40);
            *ppLVar6 = (Literal *)in_stack_ffffffffffffff20;
            in_stack_ffffffffffffff28 = pLVar1;
            ppLVar6 = DArray<Kernel::Literal_*>::operator[](in_RDI,local_40 + 1);
            *ppLVar6 = in_stack_ffffffffffffff28;
            local_40 = local_40 + 1;
          }
        }
        if (local_40 + 1 < local_30) {
          in_stack_ffffffffffffff10 = local_40 + 1;
          sVar5 = local_38 + 1;
          puVar7 = DArray<unsigned_long>::operator[]
                             (&DArray<Kernel::Literal_*>::
                               sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                               ::ft,local_38);
          *puVar7 = in_stack_ffffffffffffff10;
          local_38 = local_38 + 2;
          puVar7 = DArray<unsigned_long>::operator[]
                             (&DArray<Kernel::Literal_*>::
                               sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                               ::ft,sVar5);
          *puVar7 = local_30;
        }
        local_30 = local_40 - 1;
      } while ((local_40 != 0) && (local_28 < local_30));
      if (local_38 == 0) break;
      puVar7 = DArray<unsigned_long>::operator[]
                         (&DArray<Kernel::Literal_*>::
                           sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                           ::ft,local_38 - 2);
      local_28 = *puVar7;
      puVar7 = DArray<unsigned_long>::operator[]
                         (&DArray<Kernel::Literal_*>::
                           sortGen<true,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                           ::ft,local_38 - 1);
      local_30 = *puVar7;
      local_38 = local_38 - 2;
    }
  }
  return;
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }